

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryProgramLimitCase::iterate
          (GeometryProgramLimitCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  RenderContext *renderCtx;
  bool bVar3;
  int iVar4;
  GLenum err;
  undefined4 extraout_var;
  ShaderProgram *this_00;
  ProgramSources *pPVar5;
  int limit;
  allocator<char> local_35a;
  allocator<char> local_359;
  undefined1 local_358 [8];
  GLenum local_350;
  CallLogWrapper gl;
  ScopedLogSection section;
  string local_308 [32];
  undefined1 local_2e8 [40];
  UniquePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> program;
  StateQueryMemoryWriteGuard<int> state;
  string geometrySource;
  ContextType local_26c;
  ContextType local_268;
  ContextType local_264;
  ResultCollector result;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [176];
  pointer local_100;
  undefined1 uStack_f8;
  undefined7 uStack_f7;
  undefined1 uStack_f0;
  undefined8 uStack_ef;
  
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0," // ERROR: ",(allocator<char> *)local_358);
  tcu::ResultCollector::ResultCollector(&result,pTVar2,(string *)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard(&state);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  gl.m_enableLog = true;
  glu::CallLogWrapper::glGetIntegerv(&gl,this->m_apiName,&state.m_value);
  err = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(err,"getIntegerv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x11be);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  local_350 = this->m_apiName;
  local_358 = (undefined1  [8])glu::getGettableStateName;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_358,(ostream *)poVar1);
  std::operator<<((ostream *)poVar1," = ");
  std::ostream::operator<<(poVar1,state.m_value);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  bVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity(&state,&result)
  ;
  if (bVar3) {
    if (this->m_limit <= state.m_value) {
      limit = state.m_value;
      pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,"Types",(allocator<char> *)local_2e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_358,"Alternative queries",(allocator<char> *)&geometrySource);
      tcu::ScopedLogSection::ScopedLogSection
                (&section,pTVar2,(string *)local_1b0,(string *)local_358);
      std::__cxx11::string::~string((string *)local_358);
      std::__cxx11::string::~string((string *)local_1b0);
      deqp::gls::StateQueryUtil::verifyStateInteger(&result,&gl,this->m_apiName,limit,QUERY_BOOLEAN)
      ;
      deqp::gls::StateQueryUtil::verifyStateInteger
                (&result,&gl,this->m_apiName,limit,QUERY_INTEGER64);
      deqp::gls::StateQueryUtil::verifyStateInteger(&result,&gl,this->m_apiName,limit,QUERY_FLOAT);
      tcu::ScopedLogSection::~ScopedLogSection(&section);
      glu::CallLogWrapper::~CallLogWrapper(&gl);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                     "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(points) in;\nlayout(points, max_vertices = 1) out;\nvoid main ()\n{\n\t// Building the shader will fail if the constant value is not the expected\n\tconst mediump int cArraySize = (gl_"
                     ,&this->m_glslName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                     " == ");
      de::toString<int>((string *)local_2e8,&limit);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8)
      ;
      std::operator+(&geometrySource,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     ") ? (1) : (-1);\n\tfloat[cArraySize] fArray;\n\tfArray[0] = 0.0f;\n\tgl_Position = vec4(0.0, 0.0, 0.0, fArray[0]);\n\tEmitVertex();\n}\n"
                    );
      std::__cxx11::string::~string((string *)local_1b0);
      std::__cxx11::string::~string((string *)local_2e8);
      std::__cxx11::string::~string((string *)local_358);
      std::__cxx11::string::~string((string *)&section);
      this_00 = (ShaderProgram *)operator_new(0xd0);
      renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
      memset(local_1b0,0,0xac);
      local_100 = (pointer)0x0;
      uStack_f8 = 0;
      uStack_f7 = 0;
      uStack_f0 = 0;
      uStack_ef = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&state,
                 "${GLSL_VERSION_DECL}\nvoid main ()\n{\n\tgl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n}\n"
                 ,&local_359);
      local_264.super_ApiType.m_bits =
           (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
      specializeShader((string *)&gl,(string *)&state,&local_264);
      glu::VertexSource::VertexSource((VertexSource *)local_358,(string *)&gl);
      pPVar5 = glu::ProgramSources::operator<<
                         ((ProgramSources *)local_1b0,(ShaderSource *)local_358);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,
                 "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main ()\n{\n\tfragColor = vec4(0.0, 0.0, 0.0, 0.0);\n}\n"
                 ,&local_35a);
      local_268.super_ApiType.m_bits =
           (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
      specializeShader(&local_1d0,&local_1f0,&local_268);
      glu::FragmentSource::FragmentSource((FragmentSource *)&section,&local_1d0);
      pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)&section);
      local_26c.super_ApiType.m_bits =
           (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
      specializeShader(&local_210,&geometrySource,&local_26c);
      glu::GeometrySource::GeometrySource((GeometrySource *)local_2e8,&local_210);
      pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_2e8);
      glu::ShaderProgram::ShaderProgram(this_00,renderCtx,pPVar5);
      program.super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.
      ptr = this_00;
      std::__cxx11::string::~string((string *)(local_2e8 + 8));
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string(local_308);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&gl);
      std::__cxx11::string::~string((string *)&state);
      glu::ProgramSources::~ProgramSources((ProgramSources *)local_1b0);
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Building a test shader to verify GLSL constant ");
      std::operator<<((ostream *)poVar1,(string *)&this->m_glslName);
      std::operator<<((ostream *)poVar1," value.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      program.
                      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                      m_data.ptr);
      bVar3 = ((program.
                super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data
               .ptr)->m_program).m_info.linkOk;
      if (bVar3 == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b0,"Shader build failed",(allocator<char> *)local_358);
        tcu::ResultCollector::fail(&result,(string *)local_1b0);
        std::__cxx11::string::~string((string *)local_1b0);
        tcu::ResultCollector::setTestContextResult
                  (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      }
      else {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Build ok");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
      }
      de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
      ~UniqueBase(&program.
                   super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
      std::__cxx11::string::~string((string *)&geometrySource);
      if (bVar3 != false) {
        tcu::ResultCollector::setTestContextResult
                  (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      }
      goto LAB_011e8fe9;
    }
    de::toString<int>((string *)local_2e8,&this->m_limit);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   "Minimum value = ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ", got ");
    de::toString<int>(&geometrySource,&state.m_value);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                   &geometrySource);
    tcu::ResultCollector::fail(&result,(string *)local_1b0);
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::string::~string((string *)&geometrySource);
    std::__cxx11::string::~string((string *)local_358);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)local_2e8);
  }
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
LAB_011e8fe9:
  tcu::ResultCollector::~ResultCollector(&result);
  return STOP;
}

Assistant:

GeometryProgramLimitCase::IterateResult GeometryProgramLimitCase::iterate (void)
{
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	int						limit;

	// query limit
	{
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint>	state;
		glu::CallLogWrapper											gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

		gl.enableLogging(true);
		gl.glGetIntegerv(m_apiName, &state);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "getIntegerv()");

		m_testCtx.getLog() << tcu::TestLog::Message << glu::getGettableStateStr(m_apiName) << " = " << state << tcu::TestLog::EndMessage;

		if (!state.verifyValidity(result))
		{
			result.setTestContextResult(m_testCtx);
			return STOP;
		}

		if (state < m_limit)
		{
			result.fail("Minimum value = " + de::toString(m_limit) + ", got " + de::toString(state.get()));
			result.setTestContextResult(m_testCtx);
			return STOP;
		}

		limit = state;

		// verify other getters
		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Types", "Alternative queries");
			verifyStateInteger(result, gl, m_apiName, limit, QUERY_BOOLEAN);
			verifyStateInteger(result, gl, m_apiName, limit, QUERY_INTEGER64);
			verifyStateInteger(result, gl, m_apiName, limit, QUERY_FLOAT);
		}
	}

	// verify limit is the same in GLSL
	{
		static const char* const vertexSource =		"${GLSL_VERSION_DECL}\n"
													"void main ()\n"
													"{\n"
													"	gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n"
													"}\n";
		static const char* const fragmentSource =	"${GLSL_VERSION_DECL}\n"
													"layout(location = 0) out mediump vec4 fragColor;\n"
													"void main ()\n"
													"{\n"
													"	fragColor = vec4(0.0, 0.0, 0.0, 0.0);\n"
													"}\n";
		const std::string geometrySource =			"${GLSL_VERSION_DECL}\n"
													"${GLSL_EXT_GEOMETRY_SHADER}"
													"layout(points) in;\n"
													"layout(points, max_vertices = 1) out;\n"
													"void main ()\n"
													"{\n"
													"	// Building the shader will fail if the constant value is not the expected\n"
													"	const mediump int cArraySize = (gl_" + m_glslName + " == " + de::toString(limit) + ") ? (1) : (-1);\n"
													"	float[cArraySize] fArray;\n"
													"	fArray[0] = 0.0f;\n"
													"	gl_Position = vec4(0.0, 0.0, 0.0, fArray[0]);\n"
													"	EmitVertex();\n"
													"}\n";

		const de::UniquePtr<glu::ShaderProgram> program(new glu::ShaderProgram(m_context.getRenderContext(),
																			   glu::ProgramSources()
																			   << glu::VertexSource(specializeShader(vertexSource, m_context.getRenderContext().getType()))
																			   << glu::FragmentSource(specializeShader(fragmentSource, m_context.getRenderContext().getType()))
																			   << glu::GeometrySource(specializeShader(geometrySource, m_context.getRenderContext().getType()))));

		m_testCtx.getLog() << tcu::TestLog::Message << "Building a test shader to verify GLSL constant " << m_glslName << " value." << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << *program;

		if (!program->isOk())
		{
			// compile failed, assume static assert failed
			result.fail("Shader build failed");
			result.setTestContextResult(m_testCtx);
			return STOP;
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Build ok" << tcu::TestLog::EndMessage;
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}